

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::SkinChanged(DPlayerMenu *this,FListMenuItem *li)

{
  int iVar1;
  undefined8 in_RAX;
  FListMenuItem *pFVar2;
  int sel;
  undefined8 local_28;
  
  if (((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x1c8] & 0x20) == 0) {
    local_28 = in_RAX;
    iVar1 = userinfo_t::GetPlayerClassNum
                      ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    if (iVar1 != -1) {
      iVar1 = (*li->_vptr_FListMenuItem[0xb])(li,0,&local_28);
      if ((char)iVar1 != '\0') {
        iVar1 = (this->PlayerSkins).Array[(int)local_28];
        local_28 = CONCAT44(local_28._4_4_,iVar1);
        userinfo_t::SkinNumChanged
                  ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0),iVar1);
        UpdateTranslation(this);
        cvar_set("skin",skins[(int)local_28].name);
        local_28 = CONCAT44(0x20c,(int)local_28);
        pFVar2 = DListMenu::GetItem(&this->super_DListMenu,(FName *)((long)&local_28 + 4));
        if (pFVar2 != (FListMenuItem *)0x0) {
          (*pFVar2->_vptr_FListMenuItem[10])(pFVar2,0x10002,local_28 & 0xffffffff);
        }
      }
    }
  }
  return;
}

Assistant:

void DPlayerMenu::SkinChanged (FListMenuItem *li)
{
	if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
		players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
	{
		return;
	}

	int	sel;

	if (li->GetValue(0, &sel))
	{
		sel = PlayerSkins[sel];
		players[consoleplayer].userinfo.SkinNumChanged(sel);
		UpdateTranslation();
		cvar_set ("skin", skins[sel].name);

		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, sel);
		}
	}
}